

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::FillFreeMemory
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *address,size_t size)

{
  bool bVar1;
  BOOL BVar2;
  size_t size_local;
  void *address_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  BVar2 = Recycler::VerifyEnabled(this->heapBucket->heapInfo->recycler);
  if (BVar2 == 0) {
    bVar1 = HeapBlock::IsLeafBlock(&this->super_HeapBlock);
    if (!bVar1) {
      memset(address,0,size);
    }
  }
  else {
    memset(address,0xca,size);
  }
  return;
}

Assistant:

inline
void SmallHeapBlockT<TBlockAttributes>::FillFreeMemory(__in_bcount(size) void * address, size_t size)
{
#ifdef RECYCLER_MEMORY_VERIFY
    if (this->heapBucket->heapInfo->recycler->VerifyEnabled())
    {
        memset(address, Recycler::VerifyMemFill, size);
        return;
    }
#endif

    if (this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_THREAD_PAGE
        || this->IsWithBarrier()
#endif
        )
    {
        return;
    }

    // REVIEW: Do DbgMemFill on debug build?
#if defined(_M_IX86)
    uint qwordCount = size / sizeof(uint64) ;
    switch (qwordCount)
    {
    case 2:
        ((uint64*)address)[0] = 0;
        ((uint64*)address)[1] = 0;
        break;
    case 4:
        ((uint64*)address)[0] = 0;
        ((uint64*)address)[1] = 0;
        ((uint64*)address)[2] = 0;
        ((uint64*)address)[3] = 0;
        break;
    case 6:
        ((uint64*)address)[0] = 0;
        ((uint64*)address)[1] = 0;
        ((uint64*)address)[2] = 0;
        ((uint64*)address)[3] = 0;
        ((uint64*)address)[4] = 0;
        ((uint64*)address)[5] = 0;
        break;
    default:
        memset(address, 0, size);
    }
#else
    memset(address, 0, size);
#endif
}